

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

LockStatus __thiscall CategoriesMutex::try_lock_unsafe(CategoriesMutex *this,int category)

{
  LockStatus LVar1;
  
  if (this->current_category_ == -1 || this->current_category_ == category) {
    if (this->count_ !=
        (this->category_sizes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[category]) {
      this->current_category_ = category;
      this->count_ = this->count_ + 1;
      return LOCK_SUCCESS;
    }
    LVar1 = THREADS_COUNT_EXCEEDED;
  }
  else {
    LVar1 = ANOTHER_CATEGORY;
  }
  return LVar1;
}

Assistant:

LockStatus try_lock_unsafe(int category) {
        if (current_category_ != -1 && category != current_category_) {
            return ANOTHER_CATEGORY;
        }

        if (count_ == category_sizes_[category]) {
            return THREADS_COUNT_EXCEEDED;
        }

        current_category_ = category;
        ++count_;
        return LOCK_SUCCESS;
    }